

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O1

void __thiscall
Centaurus::ATNNode<unsigned_char>::ATNNode
          (ATNNode<unsigned_char> *this,ATNNode<unsigned_char> *old,
          vector<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
          *transitions)

{
  pointer pwVar1;
  pointer puVar2;
  
  this->_vptr_ATNNode = (_func_int **)&PTR__ATNNode_001a2718;
  std::
  vector<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
  ::vector(&this->m_transitions,transitions);
  this->m_type = old->m_type;
  (this->m_invoke)._vptr_Identifier = (_func_int **)&PTR__Identifier_001a0cd8;
  (this->m_invoke).m_id._M_dataplus._M_p = (pointer)&(this->m_invoke).m_id.field_2;
  pwVar1 = (old->m_invoke).m_id._M_dataplus._M_p;
  std::__cxx11::wstring::_M_construct<wchar_t*>
            ((wstring *)&(this->m_invoke).m_id,pwVar1,pwVar1 + (old->m_invoke).m_id._M_string_length
            );
  (this->m_nfa).super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>._vptr_NFABase =
       (_func_int **)&PTR__NFABase_001a27a0;
  std::
  vector<Centaurus::NFABaseState<unsigned_char,_int>,_std::allocator<Centaurus::NFABaseState<unsigned_char,_int>_>_>
  ::vector(&(this->m_nfa).super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>.m_states,
           &(old->m_nfa).super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>.m_states);
  (this->m_nfa).super_NFABase<Centaurus::NFABaseState<unsigned_char,_int>_>._vptr_NFABase =
       (_func_int **)&PTR__NFABase_001a2748;
  (this->m_literal)._M_dataplus._M_p = (pointer)&(this->m_literal).field_2;
  puVar2 = (old->m_literal)._M_dataplus._M_p;
  std::__cxx11::
  basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>::
  _M_construct<unsigned_char*>
            ((basic_string<unsigned_char,std::char_traits<unsigned_char>,std::allocator<unsigned_char>>
              *)&this->m_literal,puVar2,puVar2 + (old->m_literal)._M_string_length);
  this->m_localid = old->m_localid;
  return;
}

Assistant:

ATNNode(const ATNNode<TCHAR>& old, std::vector<ATNTransition<TCHAR> >&& transitions)
        : m_transitions(transitions), m_type(old.m_type), m_invoke(old.m_invoke), m_nfa(old.m_nfa), m_literal(old.m_literal), m_localid(old.m_localid)
    {
    }